

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O3

void populateAigPointerUnitGF
               (Aig_Man_t *pAigNew,ltlNode *topASTNode,Vec_Ptr_t *vSignal,Vec_Vec_t *vAigGFMap)

{
  uint uVar1;
  int iVar2;
  ltlNode_t *plVar3;
  ltlNode *pLtlNode;
  Aig_Obj_t *pAVar4;
  long lVar5;
  void **ppvVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  
  do {
    switch(topASTNode->type) {
    case AND:
    case OR:
    case IMPLY:
      populateAigPointerUnitGF(pAigNew,topASTNode->left,vSignal,vAigGFMap);
      lVar5 = 0x20;
      break;
    case NOT:
      lVar5 = 0x18;
      break;
    case GLOBALLY:
      goto switchD_0059174b_caseD_4;
    default:
      puts("\nINVALID situation: aborting...");
      exit(0);
    case BOOL:
      return;
    }
    topASTNode = *(ltlNode **)((long)&topASTNode->type + lVar5);
  } while( true );
LAB_00591941:
  uVar9 = uVar8 & 0xffffffff;
  goto LAB_00591943;
switchD_0059174b_caseD_4:
  plVar3 = topASTNode->left;
  plVar3->type = EVENTUALLY;
  pLtlNode = plVar3->left;
  pAVar4 = pLtlNode->pObj;
  if (pLtlNode->type == BOOL) {
    if (pAVar4 == (Aig_Obj_t *)0x0) {
      __assert_fail("nextToNextNode->pObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                    ,0x20e,
                    "void populateAigPointerUnitGF(Aig_Man_t *, ltlNode *, Vec_Ptr_t *, Vec_Vec_t *)"
                   );
    }
    uVar1 = vSignal->nSize;
    if (0 < (int)uVar1) {
      uVar9 = 0;
      do {
        if ((Aig_Obj_t *)vSignal->pArray[uVar9] == pAVar4) goto LAB_00591943;
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
    if (uVar1 == vSignal->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vSignal->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vSignal->pArray,0x80);
        }
        vSignal->pArray = ppvVar6;
        vSignal->nCap = 0x10;
      }
      else {
        sVar7 = (ulong)uVar1 << 4;
        if (vSignal->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(sVar7);
        }
        else {
          ppvVar6 = (void **)realloc(vSignal->pArray,sVar7);
        }
        vSignal->pArray = ppvVar6;
        vSignal->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar6 = vSignal->pArray;
    }
    iVar2 = vSignal->nSize;
    vSignal->nSize = iVar2 + 1U;
    ppvVar6[iVar2] = pAVar4;
    uVar9 = 0xffffffff;
    if (-1 < (long)iVar2) {
      uVar8 = 0;
      do {
        if ((Aig_Obj_t *)vSignal->pArray[uVar8] == pLtlNode->pObj) goto LAB_00591941;
        uVar8 = uVar8 + 1;
      } while (iVar2 + 1U != uVar8);
    }
  }
  else {
    if (pAVar4 != (Aig_Obj_t *)0x0) {
      __assert_fail("nextToNextNode->pObj == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                    ,0x21a,
                    "void populateAigPointerUnitGF(Aig_Man_t *, ltlNode *, Vec_Ptr_t *, Vec_Vec_t *)"
                   );
    }
    buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode);
    pAVar4 = pLtlNode->pObj;
    uVar1 = vSignal->nSize;
    if (0 < (int)uVar1) {
      uVar9 = 0;
      do {
        if ((Aig_Obj_t *)vSignal->pArray[uVar9] == pAVar4) goto LAB_00591943;
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
    if (uVar1 == vSignal->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vSignal->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vSignal->pArray,0x80);
        }
        vSignal->pArray = ppvVar6;
        vSignal->nCap = 0x10;
      }
      else {
        sVar7 = (ulong)uVar1 << 4;
        if (vSignal->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(sVar7);
        }
        else {
          ppvVar6 = (void **)realloc(vSignal->pArray,sVar7);
        }
        vSignal->pArray = ppvVar6;
        vSignal->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar6 = vSignal->pArray;
    }
    iVar2 = vSignal->nSize;
    vSignal->nSize = iVar2 + 1U;
    ppvVar6[iVar2] = pAVar4;
    uVar9 = 0xffffffff;
    if (-1 < (long)iVar2) {
      uVar8 = 0;
      do {
        if ((Aig_Obj_t *)vSignal->pArray[uVar8] == pLtlNode->pObj) goto LAB_00591941;
        uVar8 = uVar8 + 1;
      } while (iVar2 + 1U != uVar8);
    }
  }
LAB_00591943:
  Vec_VecPush(vAigGFMap,(int)uVar9,topASTNode);
  return;
}

Assistant:

void populateAigPointerUnitGF( Aig_Man_t *pAigNew, ltlNode *topASTNode, Vec_Ptr_t *vSignal, Vec_Vec_t *vAigGFMap )
{
	ltlNode *nextNode, *nextToNextNode;
	int serialNumSignal;

	switch( topASTNode->type ){
		case AND:
		case OR:
		case IMPLY:
			populateAigPointerUnitGF( pAigNew, topASTNode->left, vSignal, vAigGFMap );
			populateAigPointerUnitGF( pAigNew, topASTNode->right, vSignal, vAigGFMap );
			return;
		case NOT:
			populateAigPointerUnitGF( pAigNew, topASTNode->left, vSignal, vAigGFMap );
			return;
		case GLOBALLY:
			nextNode = topASTNode->left;
			assert( nextNode->type = EVENTUALLY );
			nextToNextNode = nextNode->left;
			if( nextToNextNode->type == BOOL )
			{
				assert( nextToNextNode->pObj );
				serialNumSignal = Vec_PtrFind( vSignal, nextToNextNode->pObj );
				if( serialNumSignal == -1 )
				{					
					Vec_PtrPush( vSignal, nextToNextNode->pObj );
					serialNumSignal = Vec_PtrFind( vSignal, nextToNextNode->pObj );
				}
				//Vec_PtrPush( vGLOBALLY, topASTNode );
				Vec_VecPush( vAigGFMap, serialNumSignal, topASTNode );
			}
			else
			{
				assert( nextToNextNode->pObj == NULL );
				buildLogicFromLTLNode_combinationalOnly( pAigNew, nextToNextNode );
				serialNumSignal = Vec_PtrFind( vSignal, nextToNextNode->pObj );
				if( serialNumSignal == -1 )
				{
					Vec_PtrPush( vSignal, nextToNextNode->pObj );
					serialNumSignal = Vec_PtrFind( vSignal, nextToNextNode->pObj );
				}
				//Vec_PtrPush( vGLOBALLY, topASTNode );
				Vec_VecPush( vAigGFMap, serialNumSignal, topASTNode );
			}
			return;
		case BOOL:
			return;
		default:
			printf("\nINVALID situation: aborting...\n");
			exit(0);
	}
}